

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
* toml::detail::parse_simple_key<toml::type_config>
            (result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
             *__return_storage_ptr__,location *loc,context<toml::type_config> *ctx)

{
  element_type *peVar1;
  ulong *puVar2;
  long lVar3;
  long *plVar4;
  _Alloc_hider _Var5;
  value_type *pvVar6;
  error_info *v;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last;
  char *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  size_type sVar8;
  failure<toml::error_info> *__return_storage_ptr___00;
  bool bVar9;
  string postfix;
  result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
  str_res;
  string local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  string local_320;
  string local_300;
  error_info local_2e0;
  repeat_at_least local_288;
  long *local_270;
  undefined8 local_268;
  long local_260;
  undefined8 uStack_258;
  ulong *local_250;
  undefined8 local_248;
  ulong local_240;
  undefined8 uStack_238;
  ulong *local_230;
  undefined8 local_228;
  ulong local_220;
  undefined8 uStack_218;
  result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
  local_210;
  location local_180;
  failure<toml::error_info> local_138;
  failure<toml::error_info> local_e0;
  failure<toml::error_info> local_88;
  
  peVar1 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  last._M_current =
       (peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_start;
  if (loc->location_ <
      (ulong)((long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)last._M_current)) {
    if (last._M_current[loc->location_] != '\'') {
      if (last._M_current[loc->location_] != '\"') goto LAB_003c585f;
      parse_basic_string_only<toml::type_config>(&local_210,loc,ctx);
      if (local_210.is_ok_ != true) {
        v = result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
            ::unwrap_err(&local_210,(source_location)0x555f60);
        __return_storage_ptr___00 = &local_88;
        goto LAB_003c5c76;
      }
      pvVar6 = result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
               ::unwrap(&local_210,(source_location)0x555f48);
      puVar2 = (ulong *)(pvVar6->first)._M_dataplus._M_p;
      local_220 = (pvVar6->first).field_2._M_allocated_capacity;
      paVar7 = &(pvVar6->first).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar2 == paVar7) {
        sVar8 = (pvVar6->first)._M_string_length;
        uStack_218 = *(undefined8 *)((long)&(pvVar6->first).field_2 + 8);
        (pvVar6->first)._M_string_length = 0;
        (pvVar6->first).field_2._M_local_buf[0] = '\0';
        __return_storage_ptr__->is_ok_ = true;
        (__return_storage_ptr__->field_1).succ_.value._M_dataplus._M_p =
             (pointer)((long)&__return_storage_ptr__->field_1 + 0x10);
LAB_003c5cd3:
        (__return_storage_ptr__->field_1).succ_.value.field_2._M_allocated_capacity = local_220;
        *(undefined8 *)((long)&(__return_storage_ptr__->field_1).succ_.value.field_2 + 8) =
             uStack_218;
      }
      else {
        sVar8 = (pvVar6->first)._M_string_length;
        (pvVar6->first)._M_dataplus._M_p = (pointer)paVar7;
        (pvVar6->first)._M_string_length = 0;
        (pvVar6->first).field_2._M_local_buf[0] = '\0';
        __return_storage_ptr__->is_ok_ = true;
        (__return_storage_ptr__->field_1).succ_.value._M_dataplus._M_p =
             (pointer)((long)&__return_storage_ptr__->field_1 + 0x10);
        if (puVar2 == &local_220) goto LAB_003c5cd3;
        (__return_storage_ptr__->field_1).succ_.value._M_dataplus._M_p = (pointer)puVar2;
        (__return_storage_ptr__->field_1).succ_.value.field_2._M_allocated_capacity = local_220;
      }
      local_230 = &local_220;
      (__return_storage_ptr__->field_1).succ_.value._M_string_length = sVar8;
      local_228 = 0;
      local_220 = local_220 & 0xffffffffffffff00;
      goto LAB_003c5d57;
    }
    parse_literal_string_only<toml::type_config>(&local_210,loc,ctx);
    if (local_210.is_ok_ != true) {
      v = result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
          ::unwrap_err(&local_210,(source_location)0x555f90);
      __return_storage_ptr___00 = &local_e0;
LAB_003c5c76:
      err<toml::error_info>(__return_storage_ptr___00,v);
      __return_storage_ptr__->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
                 __return_storage_ptr___00);
      failure<toml::error_info>::~failure(__return_storage_ptr___00);
      goto LAB_003c5d57;
    }
    pvVar6 = result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
             ::unwrap(&local_210,(source_location)0x555f78);
    puVar2 = (ulong *)(pvVar6->first)._M_dataplus._M_p;
    local_240 = (pvVar6->first).field_2._M_allocated_capacity;
    paVar7 = &(pvVar6->first).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar2 == paVar7) {
      sVar8 = (pvVar6->first)._M_string_length;
      uStack_238 = *(undefined8 *)((long)&(pvVar6->first).field_2 + 8);
      (pvVar6->first)._M_string_length = 0;
      (pvVar6->first).field_2._M_local_buf[0] = '\0';
      __return_storage_ptr__->is_ok_ = true;
      (__return_storage_ptr__->field_1).succ_.value._M_dataplus._M_p =
           (pointer)((long)&__return_storage_ptr__->field_1 + 0x10);
LAB_003c5d31:
      (__return_storage_ptr__->field_1).succ_.value.field_2._M_allocated_capacity = local_240;
      *(undefined8 *)((long)&(__return_storage_ptr__->field_1).succ_.value.field_2 + 8) = uStack_238
      ;
    }
    else {
      sVar8 = (pvVar6->first)._M_string_length;
      (pvVar6->first)._M_dataplus._M_p = (pointer)paVar7;
      (pvVar6->first)._M_string_length = 0;
      (pvVar6->first).field_2._M_local_buf[0] = '\0';
      __return_storage_ptr__->is_ok_ = true;
      (__return_storage_ptr__->field_1).succ_.value._M_dataplus._M_p =
           (pointer)((long)&__return_storage_ptr__->field_1 + 0x10);
      if (puVar2 == &local_240) goto LAB_003c5d31;
      (__return_storage_ptr__->field_1).succ_.value._M_dataplus._M_p = (pointer)puVar2;
      (__return_storage_ptr__->field_1).succ_.value.field_2._M_allocated_capacity = local_240;
    }
    local_250 = &local_240;
    (__return_storage_ptr__->field_1).succ_.value._M_string_length = sVar8;
    local_248 = 0;
    local_240 = local_240 & 0xffffffffffffff00;
LAB_003c5d57:
    if (local_210.is_ok_ == true) {
      success<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>_>
      ::~success(&local_210.field_1.succ_);
      return __return_storage_ptr__;
    }
    failure<toml::error_info>::~failure((failure<toml::error_info> *)&local_210.field_1.succ_);
    return __return_storage_ptr__;
  }
LAB_003c585f:
  syntax::unquoted_key((repeat_at_least *)&local_2e0,&ctx->toml_spec_);
  repeat_at_least::scan((region *)&local_210,(repeat_at_least *)&local_2e0,loc);
  if ((long *)local_2e0.title_.field_2._M_allocated_capacity != (long *)0x0) {
    (**(code **)(*(long *)local_2e0.title_.field_2._M_allocated_capacity + 8))();
  }
  if ((long *)CONCAT71(local_210._1_7_,local_210.is_ok_) == (long *)0x0) {
    local_340._M_string_length = 0;
    local_340.field_2._M_local_buf[0] = '\0';
    __s = "Hint: non-ASCII scripts are allowed in toml v1.1.0, but not in v1.0.0.\n";
    bVar9 = (ctx->toml_spec_).v1_1_0_allow_non_english_in_bare_keys != false;
    if (bVar9) {
      __s = "Hint: Not all Unicode characters are allowed as bare key.\n";
    }
    sVar8 = 0x47;
    if (bVar9) {
      sVar8 = 0x3a;
    }
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_340,0,0,__s,sVar8);
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_300,
               "toml::parse_simple_key: invalid key: key must be \"quoted\", \'quoted-literal\', or bare key."
               ,"");
    syntax::unquoted_key(&local_288,&ctx->toml_spec_);
    location::location(&local_180,loc);
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_320,local_340._M_dataplus._M_p,
               local_340._M_dataplus._M_p + local_340._M_string_length);
    make_syntax_error<toml::detail::repeat_at_least>
              (&local_2e0,&local_300,&local_288,&local_180,&local_320);
    err<toml::error_info>(&local_138,&local_2e0);
    __return_storage_ptr__->is_ok_ = false;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_138);
    failure<toml::error_info>::~failure(&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0.suffix_._M_dataplus._M_p != &local_2e0.suffix_.field_2) {
      operator_delete(local_2e0.suffix_._M_dataplus._M_p,
                      local_2e0.suffix_.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_2e0.locations_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0.title_._M_dataplus._M_p != &local_2e0.title_.field_2) {
      operator_delete(local_2e0.title_._M_dataplus._M_p,
                      local_2e0.title_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    location::~location(&local_180);
    if (local_288.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
        (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
         )0x0) {
      (*(*(_func_int ***)
          local_288.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,
                      CONCAT71(local_340.field_2._M_allocated_capacity._1_7_,
                               local_340.field_2._M_local_buf[0]) + 1);
    }
    goto LAB_003c5c2a;
  }
  lVar3 = *(long *)CONCAT71(local_210._1_7_,local_210.is_ok_);
  make_string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_360,
             (detail *)
             (&((local_210.field_1.fail_.value.locations_.
                 super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).is_ok_ + lVar3),
             (uchar *)(lVar3 + local_210.field_1._72_8_),last);
  sVar8 = local_360._M_string_length;
  _Var5._M_p = (pointer)&local_360.field_2;
  plVar4 = (long *)CONCAT71(local_360.field_2._M_allocated_capacity._1_7_,
                            local_360.field_2._M_local_buf[0]);
  if (local_360._M_dataplus._M_p == _Var5._M_p) {
    local_2e0.title_.field_2._8_8_ = local_360.field_2._8_8_;
    _Var5._M_p = local_360._M_dataplus._M_p;
LAB_003c5bbe:
    local_360._M_dataplus._M_p = _Var5._M_p;
    local_2e0.title_._M_dataplus._M_p = (pointer)&local_2e0.title_.field_2;
    local_2e0.title_._M_string_length = 0;
    local_2e0.title_.field_2._M_allocated_capacity =
         (ulong)(uint7)local_360.field_2._M_allocated_capacity._1_7_ << 8;
    uStack_258 = local_2e0.title_.field_2._8_8_;
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ_.value._M_dataplus._M_p =
         (pointer)((long)&__return_storage_ptr__->field_1 + 0x10);
    _Var5._M_p = local_360._M_dataplus._M_p;
LAB_003c5c04:
    local_360._M_dataplus._M_p = _Var5._M_p;
    (__return_storage_ptr__->field_1).succ_.value.field_2._M_allocated_capacity = (size_type)plVar4;
    *(undefined8 *)((long)&(__return_storage_ptr__->field_1).succ_.value.field_2 + 8) = uStack_258;
  }
  else {
    local_2e0.title_._M_string_length = local_360._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p == &local_2e0.title_.field_2) goto LAB_003c5bbe;
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ_.value._M_dataplus._M_p =
         (pointer)((long)&__return_storage_ptr__->field_1 + 0x10);
    local_2e0.title_.field_2._M_allocated_capacity = (size_type)plVar4;
    if ((long *)local_360._M_dataplus._M_p == &local_260) goto LAB_003c5c04;
    (__return_storage_ptr__->field_1).succ_.value._M_dataplus._M_p = local_360._M_dataplus._M_p;
    (__return_storage_ptr__->field_1).succ_.value.field_2._M_allocated_capacity = (size_type)plVar4;
    local_360._M_dataplus._M_p = _Var5._M_p;
  }
  local_360.field_2._M_local_buf[0] = '\0';
  local_360._M_string_length = 0;
  local_270 = &local_260;
  (__return_storage_ptr__->field_1).succ_.value._M_string_length = sVar8;
  local_268 = 0;
  local_260 = (ulong)(uint7)local_360.field_2._M_allocated_capacity._1_7_ << 8;
LAB_003c5c2a:
  region::~region((region *)&local_210);
  return __return_storage_ptr__;
}

Assistant:

result<typename basic_value<TC>::key_type, error_info>
parse_simple_key(location& loc, const context<TC>& ctx)
{
    using key_type = typename basic_value<TC>::key_type;
    const auto& spec = ctx.toml_spec();

    if(loc.current() == '\"')
    {
        auto str_res = parse_basic_string_only(loc, ctx);
        if(str_res.is_ok())
        {
            return ok(std::move(str_res.unwrap().first));
        }
        else
        {
            return err(std::move(str_res.unwrap_err()));
        }
    }
    else if(loc.current() == '\'')
    {
        auto str_res = parse_literal_string_only(loc, ctx);
        if(str_res.is_ok())
        {
            return ok(std::move(str_res.unwrap().first));
        }
        else
        {
            return err(std::move(str_res.unwrap_err()));
        }
    }

    // bare key.

    if(const auto bare = syntax::unquoted_key(spec).scan(loc))
    {
        return ok(string_conv<key_type>(bare.as_string()));
    }
    else
    {
        std::string postfix;
        if(spec.v1_1_0_allow_non_english_in_bare_keys)
        {
            postfix = "Hint: Not all Unicode characters are allowed as bare key.\n";
        }
        else
        {
            postfix = "Hint: non-ASCII scripts are allowed in toml v1.1.0, but not in v1.0.0.\n";
        }
        return err(make_syntax_error("toml::parse_simple_key: "
            "invalid key: key must be \"quoted\", 'quoted-literal', or bare key.",
            syntax::unquoted_key(spec), loc, postfix));
    }
}